

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCuFunc.cpp
# Opt level: O0

void __thiscall NaCustomFunc::Load(NaCustomFunc *this,NaDataStream *ds)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  NaReal *pNVar7;
  long *in_RSI;
  long *in_RDI;
  double dVar8;
  NaCreateExternFuncProto create;
  char *filepath_1;
  char *filepath;
  NaException exCode;
  char *number;
  char *szPrevOpt;
  char *filename;
  char *s;
  char *szArg;
  char *szKey;
  uint in_stack_fffffffffffffecc;
  NaVector *in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffeec;
  NaVector *in_stack_fffffffffffffef0;
  char *local_50;
  
  (**(code **)(*in_RDI + 0x70))();
  do {
    while( true ) {
      while( true ) {
        pcVar2 = (char *)(**(code **)(*in_RSI + 0x18))();
        pcVar3 = strtok(pcVar2," ");
        sVar4 = strlen(pcVar2);
        pcVar2 = pcVar2 + sVar4 + 1;
        iVar1 = strcmp(pcVar3,"file");
        if (iVar1 != 0) break;
        pcVar3 = strtok(pcVar2," ");
        if ((in_RDI[8] != 0) && ((void *)in_RDI[8] != (void *)0x0)) {
          operator_delete__((void *)in_RDI[8]);
        }
        sVar4 = strlen(pcVar3);
        pvVar5 = operator_new__(sVar4 + 1);
        in_RDI[8] = (long)pvVar5;
        strcpy((char *)in_RDI[8],pcVar3);
      }
      iVar1 = strcmp(pcVar3,"options");
      if (iVar1 != 0) break;
      if (in_RDI[9] == 0) {
        sVar4 = strlen(pcVar2);
        pvVar5 = operator_new__(sVar4 + 1);
        in_RDI[9] = (long)pvVar5;
        strcpy((char *)in_RDI[9],pcVar2);
      }
      else {
        pcVar3 = (char *)in_RDI[9];
        sVar4 = strlen(pcVar3);
        sVar6 = strlen(pcVar2);
        pvVar5 = operator_new__(sVar4 + 2 + sVar6);
        in_RDI[9] = (long)pvVar5;
        sprintf((char *)in_RDI[9],"%s %s",pcVar3,pcVar2);
      }
    }
    iVar1 = strcmp(pcVar3,"initial");
    if (iVar1 == 0) {
      local_50 = strtok(pcVar2," ");
      while (local_50 != (char *)0x0) {
        NaVector::dim((NaVector *)(in_RDI + 10));
        NaVector::new_dim(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        dVar8 = atof(local_50);
        NaVector::dim((NaVector *)(in_RDI + 10));
        pNVar7 = NaVector::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        *pNVar7 = dVar8;
        local_50 = strtok((char *)0x0," ");
      }
    }
  } while( true );
}

Assistant:

void
NaCustomFunc::Load (NaDataStream& ds)
{
  // Remove all previous functions
  Clean();

  // Read line-by-line
  while(true){
    try{
      char	*szKey, *szArg, *s = ds.GetData();

      szKey = strtok(s, " ");
      szArg = s + strlen(s) + 1;

      if(!strcmp(szKey, NaCF_file)){
	char	*filename = strtok(szArg, " ");

	// Replace file instead of old one
	if(NULL != szFile)
	  delete[] szFile;
	szFile = new char[strlen(filename) + 1];
	strcpy(szFile, filename);
      }else if(!strcmp(szKey, NaCF_options)){
	// Concatenate options
	if(NULL == szOptions){
	  szOptions = new char[strlen(szArg) + 1];
	  strcpy(szOptions, szArg);
	}else{
	  char	*szPrevOpt = szOptions;
	  szOptions = new char[strlen(szPrevOpt) + strlen(szArg) + 2];
	  sprintf(szOptions, "%s %s", szPrevOpt, szArg);
	}
      }else if(!strcmp(szKey, NaCF_initial)){
	char	*number;
	for(number = strtok(szArg, " ");
	    NULL != number;
	    number = strtok(NULL, " ")){
	  vInitial.new_dim(vInitial.dim() + 1);
	  vInitial[vInitial.dim() - 1] = atof(number);
	}
      }
    }catch(NaException exCode){
      if(na_end_of_partition == exCode ||
	 na_end_of_file == exCode)
	break;
      NaPrintLog("Exception %s while NaCustomFunc::Load(ds)\n",
		 NaExceptionMsg(exCode));
    }
  }

  if(NULL == szFile){
    NaPrintLog("Shared object file is not defined for %s (instance %s).\n",
	       GetType(),
	       (NULL==GetInstance())? "is not defined": GetInstance());
    return;
  }

  // Try to load shared object file at standard location
  if(NULL != getenv(NaEXFUNC_DIR_ENV)){
    char	*filepath = new char[strlen(getenv(NaEXFUNC_DIR_ENV))
				    + strlen(szFile)
				    + strlen(NaEXFUNC_DIR_SEP)
				    + strlen(NaEXFUNC_FILE_EXT) + 1];
    sprintf(filepath, "%s%s%s%s", getenv(NaEXFUNC_DIR_ENV),
	    NaEXFUNC_DIR_SEP, szFile, NaEXFUNC_FILE_EXT);
    NaPrintLog("Loading '%s' ...\n", filepath);
#ifdef WIN32
    so = LoadLibrary(filepath);
    if(NULL == so)
      NaPrintLog("Cannot find shared object '%s': 0x%08x\n",
		 filepath, GetLastError());
#else
    so = dlopen(filepath, RTLD_LAZY);
    if(NULL == so)
      NaPrintLog("Cannot find shared object '%s': %s\n",
		 filepath, dlerror());
#endif
    delete[] filepath;
  }

  // Try to load shared object file by default system rule
  if(NULL == so){
    char	*filepath = new char[strlen(szFile)
				    + strlen(NaEXFUNC_FILE_EXT) + 1];
    sprintf(filepath, "%s%s", szFile, NaEXFUNC_FILE_EXT);

    NaPrintLog("Loading '%s' ...\n", filepath);
#ifdef WIN32
    so = LoadLibrary(filepath);
#else
    so = dlopen(filepath, RTLD_LAZY);
#endif
    delete[] filepath;
  }
  if(NULL == so){
#ifdef WIN32
    NaPrintLog("Failed to open '%s': 0x%08x\n", szFile, GetLastError());
#else
    NaPrintLog("Failed to open '%s': %s\n", szFile, dlerror());
#endif
    return;
  }

  NaCreateExternFuncProto	create =
#ifdef WIN32
	(NaCreateExternFuncProto)GetProcAddress(so, NaCreateExternFunc);
#else
	(NaCreateExternFuncProto)dlsym(so, NaCreateExternFunc);
#endif
	if(NULL == create){
#ifdef WIN32
		NaPrintLog("Bad external function object: 0x%08x\n", GetLastError());
		FreeLibrary(so);
#else
		NaPrintLog("Bad external function object: %s\n", dlerror());
		dlclose(so);
#endif
		so = NULL;
    return;
  }

  exfunc = (*create)(szOptions, vInitial);
  Assign(exfunc->InputDim(), exfunc->OutputDim());
}